

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMocker<void_(int,_int)>::InvokeWith
          (FunctionMocker<void_(int,_int)> *this,ArgumentTuple *args)

{
  ExpectationBase *pEVar1;
  ArgumentTuple *pAVar2;
  size_type sVar3;
  void *mock_obj;
  char *pcVar4;
  ostream *poVar5;
  ostream *local_808;
  ostream *local_7f8;
  bool local_7c1;
  ostream *local_7b0;
  ostream *local_7a0;
  ostream *local_788;
  bool local_762;
  bool local_761;
  string local_758;
  undefined1 local_738 [8];
  FailureCleanupHandler handle_failures;
  string local_708;
  bool local_6e2;
  byte local_6e1;
  bool need_to_report_call;
  ExpectationBase *pEStack_6e0;
  bool found;
  ExpectationBase *untyped_expectation;
  void *untyped_action;
  stringstream loc;
  ostream aoStack_6c0 [376];
  stringstream local_548 [8];
  stringstream why;
  ostream aoStack_538 [376];
  stringstream local_3c0 [8];
  stringstream ss;
  ostream local_3b0 [383];
  bool local_231;
  undefined1 local_230 [7];
  bool is_excessive;
  undefined1 local_210 [8];
  UninterestingCallCleanupHandler report_uninteresting_call;
  stringstream ss_1;
  ostream local_1f0 [399];
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  bool local_1d;
  CallReaction local_1c;
  bool need_to_report_uninteresting_call;
  ArgumentTuple *pAStack_18;
  CallReaction reaction;
  ArgumentTuple *args_local;
  FunctionMocker<void_(int,_int)> *this_local;
  
  pAStack_18 = args;
  args_local = (ArgumentTuple *)this;
  sVar3 = std::
          vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
          ::size(&(this->super_UntypedFunctionMockerBase).untyped_expectations_);
  if (sVar3 == 0) {
    mock_obj = UntypedFunctionMockerBase::MockObject(&this->super_UntypedFunctionMockerBase);
    local_1c = Mock::GetReactionOnUninterestingCalls(mock_obj);
    if (local_1c == kAllow) {
      local_761 = LogIsVisible(kInfo);
    }
    else {
      if (local_1c == kWarn) {
        local_762 = LogIsVisible(kWarning);
      }
      else {
        local_762 = true;
      }
      local_761 = local_762;
    }
    pAVar2 = pAStack_18;
    local_1d = local_761;
    if (local_761 == false) {
      pcVar4 = UntypedFunctionMockerBase::Name(&this->super_UntypedFunctionMockerBase);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,pcVar4,&local_61);
      std::operator+(&local_40,"Function call: ",&local_60);
      PerformDefaultAction(this,pAVar2,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
      std::allocator<char>::~allocator(&local_61);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&report_uninteresting_call.ss);
      local_788 = (ostream *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x200) {
        local_788 = local_1f0;
      }
      UntypedDescribeUninterestingCall(this,pAStack_18,local_788);
      pAVar2 = pAStack_18;
      local_210._0_4_ = local_1c;
      report_uninteresting_call._0_8_ = &report_uninteresting_call.ss;
      std::__cxx11::stringstream::str();
      PerformActionAndPrintResult<void,_0>(this,(void *)0x0,pAVar2,(string *)local_230,local_1f0);
      std::__cxx11::string::~string((string *)local_230);
      UntypedFunctionMockerBase::UninterestingCallCleanupHandler::~UninterestingCallCleanupHandler
                ((UninterestingCallCleanupHandler *)local_210);
      std::__cxx11::stringstream::~stringstream((stringstream *)&report_uninteresting_call.ss);
    }
  }
  else {
    local_231 = false;
    std::__cxx11::stringstream::stringstream(local_3c0);
    std::__cxx11::stringstream::stringstream(local_548);
    std::__cxx11::stringstream::stringstream((stringstream *)&untyped_action);
    untyped_expectation = (ExpectationBase *)0x0;
    local_7a0 = (ostream *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x3c0) {
      local_7a0 = local_3b0;
    }
    local_7b0 = (ostream *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x548) {
      local_7b0 = aoStack_538;
    }
    pEStack_6e0 = UntypedFindMatchingExpectation
                            (this,pAStack_18,&untyped_expectation,&local_231,local_7a0,local_7b0);
    local_6e1 = pEStack_6e0 != (ExpectationBase *)0x0;
    local_7c1 = true;
    if (((bool)local_6e1) && (local_7c1 = true, (local_231 & 1U) == 0)) {
      local_7c1 = LogIsVisible(kInfo);
    }
    pAVar2 = pAStack_18;
    pEVar1 = untyped_expectation;
    local_6e2 = local_7c1;
    if (local_7c1 == false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_708,"",(allocator<char> *)&handle_failures.field_0x27);
      PerformAction(this,pEVar1,pAVar2,&local_708);
      std::__cxx11::string::~string((string *)&local_708);
      std::allocator<char>::~allocator((allocator<char> *)&handle_failures.field_0x27);
      handle_failures.found = true;
      handle_failures.is_excessive = false;
      handle_failures._34_2_ = 0;
    }
    else {
      poVar5 = std::operator<<(local_3b0,"    Function call: ");
      pcVar4 = UntypedFunctionMockerBase::Name(&this->super_UntypedFunctionMockerBase);
      std::operator<<(poVar5,pcVar4);
      local_7f8 = (ostream *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x3c0) {
        local_7f8 = local_3b0;
      }
      UntypedPrintArgs(this,pAStack_18,local_7f8);
      if (((local_6e1 & 1) != 0) && ((local_231 & 1U) == 0)) {
        local_808 = (ostream *)0x0;
        if (&stack0x00000000 != (undefined1 *)0x6d0) {
          local_808 = aoStack_6c0;
        }
        ExpectationBase::DescribeLocationTo(pEStack_6e0,local_808);
      }
      pAVar2 = pAStack_18;
      pEVar1 = untyped_expectation;
      local_738 = (undefined1  [8])local_3c0;
      handle_failures.ss = (stringstream *)local_548;
      handle_failures.why = (stringstream *)&untyped_action;
      handle_failures.loc = (stringstream *)pEStack_6e0;
      handle_failures.untyped_expectation._0_1_ = local_6e1 & 1;
      handle_failures.untyped_expectation._1_1_ = local_231 & 1;
      std::__cxx11::stringstream::str();
      PerformActionAndPrintResult<void,_0>(this,pEVar1,pAVar2,&local_758,local_3b0);
      std::__cxx11::string::~string((string *)&local_758);
      handle_failures.found = true;
      handle_failures.is_excessive = false;
      handle_failures._34_2_ = 0;
      UntypedFunctionMockerBase::FailureCleanupHandler::~FailureCleanupHandler
                ((FailureCleanupHandler *)local_738);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&untyped_action);
    std::__cxx11::stringstream::~stringstream(local_548);
    std::__cxx11::stringstream::~stringstream(local_3c0);
  }
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
  // See the definition of untyped_expectations_ for why access to it
  // is unprotected here.
  if (untyped_expectations_.size() == 0) {
    // No expectation is set on this mock method - we have an
    // uninteresting call.

    // We must get Google Mock's reaction on uninteresting calls
    // made on this mock object BEFORE performing the action,
    // because the action may DELETE the mock object and make the
    // following expression meaningless.
    const CallReaction reaction =
        Mock::GetReactionOnUninterestingCalls(MockObject());

    // True if and only if we need to print this call's arguments and return
    // value.  This definition must be kept in sync with
    // the behavior of ReportUninterestingCall().
    const bool need_to_report_uninteresting_call =
        // If the user allows this uninteresting call, we print it
        // only when they want informational messages.
        reaction == kAllow ? LogIsVisible(kInfo) :
                           // If the user wants this to be a warning, we print
                           // it only when they want to see warnings.
            reaction == kWarn
            ? LogIsVisible(kWarning)
            :
            // Otherwise, the user wants this to be an error, and we
            // should always print detailed information in the error.
            true;

    if (!need_to_report_uninteresting_call) {
      // Perform the action without printing the call information.
      return this->PerformDefaultAction(
          std::move(args), "Function call: " + std::string(Name()));
    }

    // Warns about the uninteresting call.
    ::std::stringstream ss;
    this->UntypedDescribeUninterestingCall(&args, &ss);

    // Perform the action, print the result, and then report the uninteresting
    // call.
    //
    // We use RAII to do the latter in case R is void or a non-moveable type. In
    // either case we can't assign it to a local variable.
    //
    // Note that std::bind() is essential here.
    // We *don't* use any local callback types (like lambdas).
    // Doing so slows down compilation dramatically because the *constructor* of
    // std::function<T> is re-instantiated with different template
    // parameters each time.
    const UninterestingCallCleanupHandler report_uninteresting_call = {reaction,
                                                                       ss};

    return PerformActionAndPrintResult(nullptr, std::move(args), ss.str(), ss);
  }

  bool is_excessive = false;
  ::std::stringstream ss;
  ::std::stringstream why;
  ::std::stringstream loc;
  const void* untyped_action = nullptr;

  // The UntypedFindMatchingExpectation() function acquires and
  // releases g_gmock_mutex.

  const ExpectationBase* const untyped_expectation =
      this->UntypedFindMatchingExpectation(&args, &untyped_action,
                                           &is_excessive, &ss, &why);
  const bool found = untyped_expectation != nullptr;

  // True if and only if we need to print the call's arguments
  // and return value.
  // This definition must be kept in sync with the uses of Expect()
  // and Log() in this function.
  const bool need_to_report_call =
      !found || is_excessive || LogIsVisible(kInfo);
  if (!need_to_report_call) {
    // Perform the action without printing the call information.
    return PerformAction(untyped_action, std::move(args), "");
  }

  ss << "    Function call: " << Name();
  this->UntypedPrintArgs(&args, &ss);

  // In case the action deletes a piece of the expectation, we
  // generate the message beforehand.
  if (found && !is_excessive) {
    untyped_expectation->DescribeLocationTo(&loc);
  }

  // Perform the action, print the result, and then fail or log in whatever way
  // is appropriate.
  //
  // We use RAII to do the latter in case R is void or a non-moveable type. In
  // either case we can't assign it to a local variable.
  //
  // Note that we *don't* use any local callback types (like lambdas) here.
  // Doing so slows down compilation dramatically because the *constructor* of
  // std::function<T> is re-instantiated with different template
  // parameters each time.
  const FailureCleanupHandler handle_failures = {
      ss, why, loc, untyped_expectation, found, is_excessive};

  return PerformActionAndPrintResult(untyped_action, std::move(args), ss.str(),
                                     ss);
}